

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int encode_list_value(AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context,uint32_t count,
                     uint32_t size,AMQP_VALUE *items,_Bool use_smallest)

{
  int iVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  size_t i;
  int result;
  _Bool use_smallest_local;
  AMQP_VALUE *items_local;
  uint32_t size_local;
  uint32_t count_local;
  void *context_local;
  AMQPVALUE_ENCODER_OUTPUT encoder_output_local;
  
  if (use_smallest) {
    iVar1 = output_byte(encoder_output,context,(char)size + '\x01');
    if ((iVar1 == 0) && (iVar1 = output_byte(encoder_output,context,(uchar)count), iVar1 == 0)) {
      i._0_4_ = 0;
    }
    else {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                  ,"encode_list_value",0xed8,1,"Failed encoding list value");
      }
      i._0_4_ = 0xed9;
    }
  }
  else {
    iVar1 = size + 4;
    iVar2 = output_byte(encoder_output,context,(uchar)((uint)iVar1 >> 0x18));
    if (((((iVar2 == 0) &&
          (iVar2 = output_byte(encoder_output,context,(uchar)((uint)iVar1 >> 0x10)), iVar2 == 0)) &&
         (iVar2 = output_byte(encoder_output,context,(uchar)((uint)iVar1 >> 8)), iVar2 == 0)) &&
        ((iVar1 = output_byte(encoder_output,context,(uchar)iVar1), iVar1 == 0 &&
         (iVar1 = output_byte(encoder_output,context,(uchar)(count >> 0x18)), iVar1 == 0)))) &&
       ((iVar1 = output_byte(encoder_output,context,(uchar)(count >> 0x10)), iVar1 == 0 &&
        ((iVar1 = output_byte(encoder_output,context,(uchar)(count >> 8)), iVar1 == 0 &&
         (iVar1 = output_byte(encoder_output,context,(uchar)count), iVar1 == 0)))))) {
      i._0_4_ = 0;
    }
    else {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                  ,"encode_list_value",0xef0,1,"Failed encoding large list value");
      }
      i._0_4_ = 0xef1;
    }
  }
  if ((int)i == 0) {
    l = (LOGGER_LOG)0x0;
    while ((l < (LOGGER_LOG)(ulong)count &&
           (iVar1 = amqpvalue_encode(items[(long)l],encoder_output,context), iVar1 == 0))) {
      l = l + 1;
    }
    if (l < (LOGGER_LOG)(ulong)count) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                  ,"encode_list_value",0xf06,1,"Failed encoding element %u of the list",(int)l);
      }
      i._0_4_ = 0xf07;
    }
    else {
      i._0_4_ = 0;
    }
  }
  return (int)i;
}

Assistant:

static int encode_list_value(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context, uint32_t count, uint32_t size, AMQP_VALUE* items, bool use_smallest)
{
    int result;
    size_t i;

    if (use_smallest)
    {
        size++;

        /* Codes_SRS_AMQPVALUE_01_304: [<encoding name="list8" code="0xc0" category="compound" width="1" label="up to 2^8 - 1 list elements with total size less than 2^8 octets"/>] */
        if ((output_byte(encoder_output, context, (size & 0xFF)) != 0) ||
            (output_byte(encoder_output, context, (count & 0xFF)) != 0))
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Failed encoding list value");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }
    else
    {
        size += 4;

        /* Codes_SRS_AMQPVALUE_01_305: [<encoding name="list32" code="0xd0" category="compound" width="4" label="up to 2^32 - 1 list elements with total size less than 2^32 octets"/>] */
        if ((output_byte(encoder_output, context, (size >> 24) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (size >> 16) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (size >> 8) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, size & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (count >> 24) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (count >> 16) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (count >> 8) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, count & 0xFF) != 0))
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Failed encoding large list value");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }

    if (result == 0)
    {
        for (i = 0; i < count; i++)
        {
            if (amqpvalue_encode(items[i], encoder_output, context) != 0)
            {
                break;
            }
        }

        if (i < count)
        {
            LogError("Failed encoding element %u of the list", (unsigned int)i);
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }
    }
    return result;
}